

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureViewTestViewSampling::resetReferenceColorStorage
          (TextureViewTestViewSampling *this,uint n_layers,uint n_faces,uint n_mipmaps,
          uint n_samples)

{
  undefined1 auVar1 [16];
  _reference_color_storage *this_00;
  ulong uVar2;
  ulong uVar3;
  Vec4 *pVVar4;
  Vector<float,_4> *local_68;
  uint n_samples_local;
  uint n_mipmaps_local;
  uint n_faces_local;
  uint n_layers_local;
  TextureViewTestViewSampling *this_local;
  
  if (this->m_reference_color_storage == (_reference_color_storage *)0x0) {
    this_00 = (_reference_color_storage *)operator_new(0x18);
    _reference_color_storage::_reference_color_storage(this_00,n_faces,n_layers,n_mipmaps,n_samples)
    ;
    this->m_reference_color_storage = this_00;
  }
  else {
    this->m_reference_color_storage->n_faces = n_faces;
    this->m_reference_color_storage->n_layers = n_layers;
    this->m_reference_color_storage->n_mipmaps = n_mipmaps;
    this->m_reference_color_storage->n_samples = n_samples;
  }
  if (this->m_reference_color_storage->data != (Vec4 *)0x0) {
    pVVar4 = this->m_reference_color_storage->data;
    if (pVVar4 != (Vec4 *)0x0) {
      operator_delete__(pVVar4);
    }
    this->m_reference_color_storage->data = (Vec4 *)0x0;
  }
  uVar2 = CONCAT44(0,n_layers * n_faces * n_mipmaps * n_samples);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pVVar4 = (Vec4 *)operator_new__(uVar3);
  if (uVar2 != 0) {
    local_68 = pVVar4;
    do {
      tcu::Vector<float,_4>::Vector(local_68);
      local_68 = local_68 + 1;
    } while (local_68 != pVVar4 + uVar2);
  }
  this->m_reference_color_storage->data = pVVar4;
  return;
}

Assistant:

void TextureViewTestViewSampling::resetReferenceColorStorage(unsigned int n_layers, unsigned int n_faces,
															 unsigned int n_mipmaps, unsigned int n_samples)
{
	/* Sanity checks */
	DE_ASSERT(n_layers >= 1);
	DE_ASSERT(n_faces >= 1);
	DE_ASSERT(n_mipmaps >= 1);
	DE_ASSERT(n_samples >= 1);

	/* Allocate the descriptor if it's the first time the test will be
	 * attempting to access it */
	if (m_reference_color_storage == DE_NULL)
	{
		m_reference_color_storage = new _reference_color_storage(n_faces, n_layers, n_mipmaps, n_samples);
	}
	else
	{
		/* The descriptor's already there so we only need to update the properties */
		m_reference_color_storage->n_faces   = n_faces;
		m_reference_color_storage->n_layers  = n_layers;
		m_reference_color_storage->n_mipmaps = n_mipmaps;
		m_reference_color_storage->n_samples = n_samples;
	}

	/* If there's any data descriptor found allocated at this point,
	 * release it */
	if (m_reference_color_storage->data != DE_NULL)
	{
		delete[] m_reference_color_storage->data;

		m_reference_color_storage->data = DE_NULL;
	}

	m_reference_color_storage->data = new tcu::Vec4[n_layers * n_faces * n_mipmaps * n_samples];
}